

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O3

uint8_t * __thiscall
google::protobuf::MessageLite::SerializeWithCachedSizesToArray(MessageLite *this,uint8_t *target)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  LogMessage *other;
  EpsCopyOutputStream out;
  LogFinisher local_91;
  LogMessage local_90;
  uint8_t *local_58;
  undefined8 local_50;
  undefined8 local_28;
  undefined2 local_20;
  byte local_1e;
  
  iVar1 = (*this->_vptr_MessageLite[9])();
  local_1e = io::CodedOutputStream::default_serialization_deterministic_ & 1;
  local_50 = 0;
  local_28 = 0;
  local_20 = 0;
  local_58 = target + iVar1;
  iVar2 = (*this->_vptr_MessageLite[0xb])(this,target);
  if (target + iVar1 != (uint8_t *)CONCAT44(extraout_var,iVar2)) {
    internal::LogMessage::LogMessage
              (&local_90,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/message_lite.cc"
               ,0x161);
    other = internal::LogMessage::operator<<(&local_90,"CHECK failed: target + size == res: ");
    internal::LogFinisher::operator=(&local_91,other);
    internal::LogMessage::~LogMessage(&local_90);
  }
  return (uint8_t *)CONCAT44(extraout_var,iVar2);
}

Assistant:

uint8_t* MessageLite::SerializeWithCachedSizesToArray(uint8_t* target) const {
  // We only optimize this when using optimize_for = SPEED.  In other cases
  // we just use the CodedOutputStream path.
  return SerializeToArrayImpl(*this, target, GetCachedSize());
}